

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

void xmlParserValidityWarning(void *ctx,char *msg,...)

{
  xmlGenericErrorFunc p_Var1;
  char in_AL;
  int iVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  char *pcVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar6;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined4 local_68;
  undefined4 local_64;
  va_list ap;
  char *larger;
  int chars;
  int prev_size;
  int size;
  int len;
  char *str;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  char *msg_local;
  void *ctx_local;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  str = (char *)0x0;
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  iVar2 = xmlStrlen((xmlChar *)msg);
  if (((ctx != (void *)0x0) && (iVar2 != 0)) && (msg[iVar2 + -1] != ':')) {
    str = *(char **)((long)ctx + 0x38);
    if ((*(long *)(str + 8) == 0) && (1 < *(int *)((long)ctx + 0x40))) {
      str = *(char **)(*(long *)((long)ctx + 0x48) + (long)(*(int *)((long)ctx + 0x40) + -2) * 8);
    }
    xmlParserPrintFileInfo((xmlParserInputPtr)str);
  }
  pp_Var3 = __xmlGenericError();
  p_Var1 = *pp_Var3;
  ppvVar4 = __xmlGenericErrorContext();
  (*p_Var1)(*ppvVar4,"validity warning: ");
  larger._4_4_ = -1;
  _size = (char *)(*xmlMalloc)(0x96);
  if (_size != (char *)0x0) {
    chars = 0x96;
    pcVar5 = _size;
    do {
      _size = pcVar5;
      if (63999 < chars) break;
      ap[0].overflow_arg_area = local_118;
      ap[0]._0_8_ = &stack0x00000008;
      local_64 = 0x30;
      local_68 = 0x10;
      iVar2 = vsnprintf(_size,(long)chars,msg,&local_68);
      if (((-1 < iVar2) && (iVar2 < chars)) &&
         (bVar6 = larger._4_4_ == iVar2, larger._4_4_ = iVar2, bVar6)) break;
      if (iVar2 < 0) {
        chars = chars + 100;
      }
      else {
        chars = iVar2 + 1 + chars;
      }
      pcVar5 = (char *)(*xmlRealloc)(_size,(long)chars);
    } while (pcVar5 != (char *)0x0);
  }
  pp_Var3 = __xmlGenericError();
  p_Var1 = *pp_Var3;
  ppvVar4 = __xmlGenericErrorContext();
  (*p_Var1)(*ppvVar4,"%s",_size);
  if (_size != (char *)0x0) {
    (*xmlFree)(_size);
  }
  if (ctx != (void *)0x0) {
    xmlParserPrintFileContext((xmlParserInputPtr)str);
  }
  return;
}

Assistant:

void XMLCDECL
xmlParserValidityWarning(void *ctx, const char *msg, ...)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlParserInputPtr input = NULL;
    char * str;
    int len = xmlStrlen((const xmlChar *) msg);

    if ((ctxt != NULL) && (len != 0) && (msg[len - 1] != ':')) {
	input = ctxt->input;
	if ((input->filename == NULL) && (ctxt->inputNr > 1))
	    input = ctxt->inputTab[ctxt->inputNr - 2];

	xmlParserPrintFileInfo(input);
    }

    xmlGenericError(xmlGenericErrorContext, "validity warning: ");
    XML_GET_VAR_STR(msg, str);
    xmlGenericError(xmlGenericErrorContext, "%s", str);
    if (str != NULL)
	xmlFree(str);

    if (ctxt != NULL) {
	xmlParserPrintFileContext(input);
    }
}